

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_if::translate
          (method_if *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  element_type *peVar2;
  value_type ptVar3;
  token_base *ptVar4;
  bool bVar5;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar6;
  _Elt_pointer ppsVar7;
  int iVar8;
  const_reference pptVar9;
  token_base **pptVar10;
  _Elt_pointer pdVar11;
  bool *pbVar12;
  statement_ifelse *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Elt_pointer pptVar13;
  compile_error *this_01;
  long lVar14;
  iterator *piVar15;
  ulong uVar16;
  bool bVar17;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *p_Var18;
  size_t size;
  statement_base **ppsVar19;
  long lVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  _Map_pointer pppsVar21;
  statement_base **__args;
  statement_base **ppsVar22;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_true;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_false;
  tree_type<cs::token_base_*> local_3b8;
  tree_type<cs::token_base_*> local_3b0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_3a8;
  context_t local_3a0;
  context_t local_390;
  context_t local_380;
  context_t local_370;
  context_t local_360;
  value_type local_350;
  undefined1 local_348 [16];
  tree_node local_338;
  iterator local_318;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_2f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_2d8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_288;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_238;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_1e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_198;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_148;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_last = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_2d8,0);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2f8._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_2f8._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_2f8._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_2f8._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar20 = (long)local_2f8._M_cur - (long)local_2f8._M_first;
  lVar14 = lVar20 >> 4;
  uVar1 = lVar14 * -0x3333333333333333 + 1;
  if (lVar20 < -0x9f) {
    uVar16 = ~((lVar14 * 0x3333333333333333 - 2U) / 6);
LAB_001598b5:
    local_2f8._M_node = local_2f8._M_node + uVar16;
    local_2f8._M_first = *local_2f8._M_node;
    local_2f8._M_last = local_2f8._M_first + 6;
    local_2f8._M_cur = local_2f8._M_first + uVar16 * -6 + uVar1;
  }
  else {
    if (5 < uVar1) {
      uVar16 = uVar1 / 6;
      goto LAB_001598b5;
    }
    local_2f8._M_cur = local_2f8._M_cur + 1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)local_348,&local_2f8,&local_58,(allocator_type *)&local_288);
  translator_type::translate
            (&peVar2->translator,&peVar2->context,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_348,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8,false)
  ;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)local_348);
  ppsVar7 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
      local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    bVar17 = false;
  }
  else {
    pppsVar21 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar19 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar22 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur;
    bVar5 = false;
    do {
      iVar8 = (*(*ppsVar22)->_vptr_statement_base[2])();
      bVar17 = bVar5;
      if ((iVar8 == 0xb) && (bVar17 = true, bVar5)) {
        this_01 = (compile_error *)__cxa_allocate_exception(0x28);
        local_348._0_8_ = &local_338;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,"Multi Else Grammar.","");
        compile_error::compile_error(this_01,(string *)local_348);
        __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
      }
      ppsVar22 = ppsVar22 + 1;
      if (ppsVar22 == ppsVar19) {
        ppsVar22 = pppsVar21[1];
        pppsVar21 = pppsVar21 + 1;
        ppsVar19 = ppsVar22 + 0x40;
      }
      bVar5 = bVar17;
    } while (ppsVar22 != ppsVar7);
  }
  size = 1;
  pptVar9 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar3 = *pptVar9;
  local_348._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar10 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_348);
  ptVar4 = *pptVar10;
  if (bVar17) {
    local_318._M_last = (_Elt_pointer)0x0;
    local_318._M_node = (_Map_pointer)0x0;
    local_318._M_cur = (_Elt_pointer)0x0;
    local_318._M_first = (_Elt_pointer)0x0;
    local_338.right = (tree_node *)0x0;
    local_338.data = (token_base *)0x0;
    local_338.root = (tree_node *)0x0;
    local_338.left = (tree_node *)0x0;
    local_348._0_8_ = (tree_node *)0x0;
    local_348._8_8_ = 0;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_348
               ,0);
    local_288._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_map_size = 0;
    ppsVar19 = (statement_base **)0x0;
    local_3a8 = raw;
    local_350 = ptVar3;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              (&local_288,0);
    ppsVar7 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur !=
        local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      bVar17 = true;
      __args = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar22 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar21 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        iVar8 = (*(*__args)->_vptr_statement_base[2])();
        if (iVar8 == 0xb) {
LAB_00159a78:
          bVar17 = false;
        }
        else {
          if (!bVar17) {
            piVar15 = &local_288._M_impl.super__Deque_impl_data._M_finish;
            pdVar11 = (_Elt_pointer)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if ((_Elt_pointer)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                (_Elt_pointer)(local_288._M_impl.super__Deque_impl_data._M_finish._M_last + -1))
            goto LAB_00159ad7;
            ppsVar19 = __args;
            std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
            _M_push_back_aux<cs::statement_base*const&>
                      ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_288,
                       __args);
            goto LAB_00159a78;
          }
          piVar15 = &local_318;
          pdVar11 = (_Elt_pointer)local_318._M_cur;
          if (local_318._M_cur ==
              (_Elt_pointer)
              &(((_Elt_pointer)((long)local_318._M_last + -0x50))->
               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_node) {
            bVar17 = true;
            ppsVar19 = __args;
            std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
            _M_push_back_aux<cs::statement_base*const&>
                      ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)local_348,
                       __args);
          }
          else {
LAB_00159ad7:
            (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*__args;
            piVar15->_M_cur = piVar15->_M_cur + 1;
          }
        }
        __args = __args + 1;
        if (__args == ppsVar22) {
          __args = pppsVar21[1];
          pppsVar21 = pppsVar21 + 1;
          ppsVar22 = __args + 0x40;
        }
      } while (__args != ppsVar7);
    }
    if ((ptVar4 == (token_base *)0x0) ||
       (iVar8 = (*ptVar4->_vptr_token_base[2])(ptVar4), iVar8 != 7)) {
      this_00 = (statement_ifelse *)
                statement_base::operator_new((statement_base *)0xc8,(size_t)ppsVar19);
      pdVar6 = local_3a8;
      iVar8 = tree_type<cs::token_base_*>::copy
                        ((EVP_PKEY_CTX *)local_350[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
      local_3b0.mRoot = (tree_node *)CONCAT44(extraout_var_00,iVar8);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_148,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_348);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_198,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_288);
      local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar11 = (pdVar6->
                super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar13 ==
          (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_ifelse::statement_ifelse
                (this_00,&local_3b0,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_148,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_198,
                 &local_380,pptVar13[-1]);
      if (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_380.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_198);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_148);
      tree_type<cs::token_base_*>::destroy(local_3b0.mRoot);
    }
    else {
      pbVar12 = cs_impl::any::const_val<bool>((any *)(ptVar4 + 1));
      pdVar6 = local_3a8;
      if (*pbVar12 == true) {
        this_00 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar19);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_348);
        local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar11 = (pdVar6->
                  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar13 ==
            (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar13 = (pdVar11->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        p_Var18 = &local_a8;
        statement_block::statement_block
                  ((statement_block *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)p_Var18,
                   &local_360,pptVar13[-1]);
        this_02._M_pi =
             local_360.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      else {
        this_00 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar19);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_288)
        ;
        local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar11 = (pdVar6->
                  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar13 ==
            (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar13 = (pdVar11->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        p_Var18 = &local_f8;
        statement_block::statement_block
                  ((statement_block *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)p_Var18,
                   &local_370,pptVar13[-1]);
        this_02._M_pi =
             local_370.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (p_Var18);
    }
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_288);
    p_Var18 = (_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_348;
  }
  else {
    if ((ptVar4 == (token_base *)0x0) ||
       (iVar8 = (*ptVar4->_vptr_token_base[2])(ptVar4), iVar8 != 7)) {
      this_00 = (statement_ifelse *)statement_base::operator_new((statement_base *)0x78,size);
      iVar8 = tree_type<cs::token_base_*>::copy
                        ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
      local_3b8.mRoot = (tree_node *)CONCAT44(extraout_var,iVar8);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_238,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8);
      local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar11 = (raw->
                super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar13 ==
          (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_if::statement_if
                ((statement_if *)this_00,&local_3b8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_238,
                 &local_3a0,pptVar13[-1]);
      if (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_238);
      tree_type<cs::token_base_*>::destroy(local_3b8.mRoot);
      goto LAB_00159f69;
    }
    pbVar12 = cs_impl::any::const_val<bool>((any *)(ptVar4 + 1));
    if (*pbVar12 != true) {
      this_00 = (statement_ifelse *)0x0;
      goto LAB_00159f69;
    }
    this_00 = (statement_ifelse *)statement_base::operator_new((statement_base *)0x70,size);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1e8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8);
    local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    pdVar11 = (raw->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar13 ==
        (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar13 = (pdVar11->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_block::statement_block
              ((statement_block *)this_00,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1e8,
               &local_390,pptVar13[-1]);
    if (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_390.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var18 = &local_1e8;
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (p_Var18);
LAB_00159f69:
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_2d8);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *method_if::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		bool have_else = false;
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::else_) {
				if (!have_else)
					have_else = true;
				else
					throw compile_error("Multi Else Grammar.");
			}
		}
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (have_else) {
			std::deque<statement_base *> body_true;
			std::deque<statement_base *> body_false;
			bool now_place = true;
			for (auto &ptr: body) {
				if (ptr->get_type() == statement_types::else_) {
					now_place = false;
					continue;
				}
				if (now_place)
					body_true.push_back(ptr);
				else
					body_false.push_back(ptr);
			}
			if (ptr != nullptr && ptr->get_type() == token_types::value) {
				if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
					return new statement_block(body_true, context, raw.front().back());
				else
					return new statement_block(body_false, context, raw.front().back());
			}
			else
				return new statement_ifelse(tree, body_true, body_false, context, raw.front().back());
		}
		else if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_if(tree, body, context, raw.front().back());
	}